

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

void exedaem(voccxdef *ctx)

{
  objnum objn;
  runcxdef *ctx_00;
  objnum thisd;
  runsdef *prVar1;
  vocddef *pvVar2;
  uint uVar3;
  bool bVar4;
  runsdef val;
  errdef fr_;
  
  ctx_00 = ctx->voccxrun;
  uVar3 = ctx->voccxdmc;
  prVar1 = &ctx->voccxdmn->vocdarg;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    objn = *(objnum *)((long)(prVar1 + -1) + 8);
    if (objn != 0xffff) {
      fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
      if (fr_.errcode == 0) {
        fr_.errprv = ctx->voccxerr->errcxptr;
        ctx->voccxerr->errcxptr = &fr_;
        val.runstyp = prVar1->runstyp;
        val._1_7_ = *(undefined7 *)&prVar1->field_0x1;
        val.runsv = prVar1->runsv;
        runpush(ctx_00,(uint)val.runstyp,&val);
        runfn(ctx_00,objn,1);
        ctx->voccxerr->errcxptr = fr_.errprv;
      }
      else {
        ctx->voccxerr->errcxptr = fr_.errprv;
        if ((fr_.errcode != 0x3f5) && (fr_.errcode != 0x3fb)) goto LAB_001f04d5;
      }
    }
    prVar1 = prVar1 + 2;
  }
  uVar3 = ctx->voccxalc;
  pvVar2 = ctx->voccxalm;
  do {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar4) {
      return;
    }
    if ((pvVar2->vocdfn != 0xffff) && (pvVar2->vocdtim == 0xffff)) {
      fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
      if (fr_.errcode == 0) {
        fr_.errprv = ctx->voccxerr->errcxptr;
        ctx->voccxerr->errcxptr = &fr_;
        runpprop(ctx_00,(uchar **)0x0,0,0,pvVar2->vocdfn,pvVar2->vocdprp,0,0,pvVar2->vocdfn);
        ctx->voccxerr->errcxptr = fr_.errprv;
      }
      else {
        ctx->voccxerr->errcxptr = fr_.errprv;
        if ((fr_.errcode != 0x3f5) && (fr_.errcode != 0x3fb)) {
LAB_001f04d5:
          errrse1(ctx->voccxerr,&fr_);
        }
      }
    }
    pvVar2 = pvVar2 + 1;
  } while( true );
}

Assistant:

void exedaem(voccxdef *ctx)
{
    runcxdef *rcx = ctx->voccxrun;
    vocddef  *daemon;
    int       i;
    runsdef   val;
    int       err;

    for (i = ctx->voccxdmc, daemon = ctx->voccxdmn ; i ; ++daemon, --i)
    {
        if (daemon->vocdfn != MCMONINV)
        {
            objnum thisd = daemon->vocdfn;
            
            ERRBEGIN(ctx->voccxerr)

            OSCPYSTRUCT(val, daemon->vocdarg);
            runpush(rcx, val.runstyp, &val);
            runfn(rcx, thisd, 1);
            
            ERRCATCH(ctx->voccxerr, err)
                if (err != ERR_RUNEXIT && err != ERR_RUNEXITOBJ)
                    errrse(ctx->voccxerr);
            ERREND(ctx->voccxerr)
        }
    }
    for (i = ctx->voccxalc, daemon = ctx->voccxalm ; i ; ++daemon, --i)
    {
        if (daemon->vocdfn != MCMONINV
            && daemon->vocdtim == VOCDTIM_EACH_TURN)
        {
            ERRBEGIN(ctx->voccxerr)

            runppr(rcx, daemon->vocdfn, daemon->vocdprp, 0);
            
            ERRCATCH(ctx->voccxerr, err)
                if (err != ERR_RUNEXIT && err != ERR_RUNEXITOBJ)
                    errrse(ctx->voccxerr);
            ERREND(ctx->voccxerr)
        }
    }
}